

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  pointer pEVar1;
  Nullable<const_char_*> p;
  AlphaNum local_a8;
  AlphaNum local_78;
  size_type local_48;
  undefined8 local_40;
  
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = pEVar1[this->data_offset].encoded_package._M_dataplus;
  local_48 = pEVar1[this->data_offset].encoded_package._M_string_length;
  p = ".";
  if (local_48 == 0) {
    p = "";
  }
  local_78.piece_ = absl::lts_20250127::NullSafeStringView(p);
  local_a8.piece_._M_str = (this->encoded_symbol)._M_dataplus._M_p;
  local_a8.piece_._M_len = (this->encoded_symbol)._M_string_length;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return absl::StrCat(p, p.empty() ? "" : ".", symbol(index));
    }